

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O3

void soplex::
     updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecnnzeroes,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *resnvec,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *tmpvec,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **psccurr,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **pscprev,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *qcurr,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *qprev,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eprev1,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eprev2,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  fpclass_type fVar1;
  int32_t iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  bool bVar8;
  fpclass_type fVar9;
  undefined8 uVar10;
  int32_t iVar11;
  int iVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  long lVar15;
  uint *puVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  undefined4 *puVar18;
  uint *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  byte bVar21;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  uint local_2c8 [3];
  undefined3 uStack_2bb;
  int iStack_2b8;
  bool bStack_2b4;
  undefined8 local_2b0;
  uint local_2a4 [27];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  cpp_dec_float<200U,_int,_void> local_138;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 local_40;
  
  bVar22 = 0;
  local_2b0._0_4_ = cpp_dec_float_finite;
  local_2b0._4_4_ = 0x1c;
  local_328 = ZEXT816(0);
  local_318 = ZEXT816(0);
  local_308 = ZEXT816(0);
  local_2f8 = ZEXT816(0);
  local_2e8 = ZEXT816(0);
  local_2d8 = ZEXT816(0);
  local_2c8[0] = 0;
  local_2c8[1] = 0;
  stack0xfffffffffffffd40 = 0;
  uStack_2bb = 0;
  iStack_2b8 = 0;
  bStack_2b4 = false;
  pcVar13 = &eprev1->m_backend;
  if (((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_328 != eprev2) &&
     (pcVar13 = &eprev2->m_backend,
     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      *)local_328 != eprev1)) {
    puVar16 = (uint *)eprev1;
    puVar18 = (undefined4 *)local_328;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar18 = *puVar16;
      puVar16 = puVar16 + 1;
      puVar18 = puVar18 + 1;
    }
    iStack_2b8 = (eprev1->m_backend).exp;
    bStack_2b4 = (eprev1->m_backend).neg;
    local_2b0._0_4_ = (eprev1->m_backend).fpclass;
    local_2b0._4_4_ = (eprev1->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_328,pcVar13);
  uVar10 = local_2b0;
  bVar8 = bStack_2b4;
  iVar7 = iStack_2b8;
  uVar6 = local_328._0_4_;
  puVar16 = (uint *)(local_328 + 4);
  puVar19 = local_2a4;
  for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
  }
  fVar9 = (fpclass_type)local_2b0;
  iVar11 = local_2b0._4_4_;
  bVar4 = local_328._0_4_ != 0;
  bVar5 = (fpclass_type)local_2b0 != cpp_dec_float_finite;
  bVar3 = bVar4 || bVar5;
  bVar21 = bStack_2b4 ^ bVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator-=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  pnVar17 = epsilon;
  pcVar13 = &local_138;
  for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pcVar13->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  local_138.exp = (epsilon->m_backend).exp;
  local_138.neg = (epsilon->m_backend).neg;
  fVar1 = (epsilon->m_backend).fpclass;
  iVar2 = (epsilon->m_backend).prec_elem;
  local_138.fpclass = fVar1;
  local_138.prec_elem = iVar2;
  local_328 = CONCAT124(local_328._4_12_,uVar6);
  puVar16 = local_2a4;
  puVar19 = (uint *)(local_328 + 4);
  for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar19 = *puVar16;
    puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
  }
  iStack_2b8 = iVar7;
  bStack_2b4 = (bool)bVar21;
  local_2b0 = uVar10;
  if (bVar8 != bVar3 && (bVar4 || bVar5)) {
    bStack_2b4 = (bool)(bVar21 ^ 1);
  }
  if ((fVar1 == cpp_dec_float_NaN || fVar9 == cpp_dec_float_NaN) ||
     (iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_328,&local_138), 0 < iVar12)) {
    local_1b8.m_backend.data._M_elems[0] = uVar6;
    puVar16 = local_2a4;
    puVar19 = local_1b8.m_backend.data._M_elems + 1;
    for (lVar15 = 0x1b; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar19 = *puVar16;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
      puVar19 = puVar19 + (ulong)bVar22 * -2 + 1;
    }
    local_1b8.m_backend.exp = iVar7;
    local_1b8.m_backend.fpclass = fVar9;
    local_1b8.m_backend.prec_elem = iVar11;
    local_1b8.m_backend.neg = (bool)bVar21;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)*pscprev,&local_1b8);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(*pscprev);
  }
  pSVar14 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,pSVar14);
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  local_238 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  pcVar13 = &qcurr->m_backend;
  if (((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *)local_238 != qprev) &&
     (pcVar13 = &qprev->m_backend,
     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
      *)local_238 != qcurr)) {
    pnVar17 = qcurr;
    pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_238;
    for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    iStack_1c8 = (qcurr->m_backend).exp;
    bStack_1c4 = (qcurr->m_backend).neg;
    local_1c0._0_4_ = (qcurr->m_backend).fpclass;
    local_1c0._4_4_ = (qcurr->m_backend).prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            ((cpp_dec_float<200U,_int,_void> *)local_238,pcVar13);
  local_40._0_4_ = cpp_dec_float_finite;
  local_40._4_4_ = 0x1c;
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  uStack_48._0_4_ = 0;
  uStack_48._4_1_ = false;
  local_2b0._0_4_ = cpp_dec_float_finite;
  local_2b0._4_4_ = 0x1c;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8[0] = 0;
  local_2c8[1] = 0;
  stack0xfffffffffffffd40 = 0;
  uStack_2bb = 0;
  iStack_2b8 = 0;
  bStack_2b4 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_328,1.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_b8,(cpp_dec_float<200U,_int,_void> *)local_328,
             (cpp_dec_float<200U,_int,_void> *)local_238);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_b8);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator+=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)*pscprev,*psccurr);
  pSVar14 = *psccurr;
  *psccurr = *pscprev;
  *pscprev = pSVar14;
  return;
}

Assistant:

static void updateScale(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R qcurr,
   R qprev,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);
   assert(qcurr * qprev != 0.0);

   R fac = -(eprev1 * eprev2);

   SSVectorBase<R>* pssv;

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);

   *pscprev *= 1.0 / (qcurr * qprev);
   *pscprev += *psccurr;

   /* swap pointers */
   pssv = psccurr;
   psccurr = pscprev;
   pscprev = pssv;
}